

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall Renderer::setPatternRepeat(Renderer *this,bool repeat)

{
  QMutex *pQVar1;
  QMutex *pQVar2;
  bool bVar3;
  
  bVar3 = AudioStream::isEnabled(&this->mStream);
  if (bVar3) {
    pQVar1 = &(this->mContext).mMutex;
    pQVar2 = &(this->mContext).mMutex;
    LOCK();
    bVar3 = (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (pQVar2->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar3) {
      QBasicMutex::lockInternal();
    }
    trackerboy::Engine::repeatPattern(&(this->mContext).mHandle.engine,repeat);
    LOCK();
    bVar3 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar3) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar3) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void Renderer::setPatternRepeat(bool repeat) {

    if (mStream.isEnabled()) {
        mContext.access()->engine.repeatPattern(repeat);
    }
}